

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O2

void Ptex::v2_2::(anonymous_namespace)::Apply<unsigned_short,2>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int param_5)

{
  uint *puVar1;
  float fVar2;
  byte bVar3;
  int iVar4;
  float *pfVar5;
  float *pfVar6;
  uint *puVar7;
  long lVar8;
  long lVar9;
  float fVar10;
  float fVar11;
  
  bVar3 = (k->res).ulog2;
  iVar4 = k->uw;
  pfVar6 = k->kv;
  puVar7 = (uint *)((long)data + ((long)(k->v << (bVar3 & 0x1f)) + (long)k->u) * 4);
  lVar8 = (long)(2 << (bVar3 & 0x1f));
  puVar1 = (uint *)((long)puVar7 + k->vw * lVar8 * 2);
  pfVar5 = k->ku;
  for (; puVar7 != puVar1; puVar7 = (uint *)((long)puVar7 + lVar8 * 2)) {
    fVar11 = *pfVar5;
    fVar10 = fVar11 * (float)(*puVar7 & 0xffff);
    fVar11 = fVar11 * (float)(*puVar7 >> 0x10);
    for (lVar9 = 4; (long)(iVar4 * 2) * 2 != lVar9; lVar9 = lVar9 + 4) {
      fVar2 = *(float *)((long)pfVar5 + lVar9);
      fVar10 = fVar10 + fVar2 * (float)(*(uint *)((long)puVar7 + lVar9) & 0xffff);
      fVar11 = fVar11 + fVar2 * (float)(*(uint *)((long)puVar7 + lVar9) >> 0x10);
    }
    fVar2 = *pfVar6;
    pfVar6 = pfVar6 + 1;
    *(ulong *)result =
         CONCAT44(fVar11 * fVar2 + (float)((ulong)*(undefined8 *)result >> 0x20),
                  fVar10 * fVar2 + (float)*(undefined8 *)result);
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }